

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

ssize_t __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write
          (writer_base<cppwinrt::writer> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string local_48;
  undefined1 local_28 [16];
  unsigned_long local_18;
  unsigned_long value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  value_local = (unsigned_long)this;
  std::__cxx11::to_string(&local_48,local_18);
  local_28 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  write(this,(int)local_28,local_28._8_8_,__n);
  sVar1 = ::std::__cxx11::string::~string((string *)&local_48);
  return sVar1;
}

Assistant:

void write(unsigned long const value)
        {
            write(std::to_string(value));
        }